

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer-test.cc
# Opt level: O0

void __thiscall
Buffer_change_event_add_pagebreak_Test::TestBody(Buffer_change_event_add_pagebreak_Test *this)

{
  bool bVar1;
  char *message;
  AssertHelper local_110;
  Message local_108;
  size_type local_100;
  int local_f4;
  undefined1 local_f0 [8];
  AssertionResult gtest_ar;
  undefined1 local_d0 [8];
  BufferWithReadonlyStrings local;
  Buffer_change_event_add_pagebreak_Test *this_local;
  
  local.changes.super__Vector_base<bfy_changed_cb_info,_std::allocator<bfy_changed_cb_info>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  anon_unknown.dwarf_16b2d::BufferWithReadonlyStrings::BufferWithReadonlyStrings
            ((BufferWithReadonlyStrings *)local_d0);
  anon_unknown.dwarf_16b2d::BufferWithReadonlyStrings::start_listening_to_changes
            ((BufferWithReadonlyStrings *)local_d0);
  bfy_buffer_add_pagebreak((bfy_buffer *)local_d0);
  local_f4 = 0;
  local_100 = std::size<std::vector<bfy_changed_cb_info,std::allocator<bfy_changed_cb_info>>>
                        ((vector<bfy_changed_cb_info,_std::allocator<bfy_changed_cb_info>_> *)
                         ((long)&local.allstrs.field_2 + 8));
  testing::internal::EqHelper::Compare<int,_unsigned_long,_nullptr>
            ((EqHelper *)local_f0,"0","std::size(local.changes)",&local_f4,&local_100);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f0);
  if (!bVar1) {
    testing::Message::Message(&local_108);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_f0);
    testing::internal::AssertHelper::AssertHelper
              (&local_110,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/ckerr[P]buffy/tests/buffer-test.cc"
               ,0x59f,message);
    testing::internal::AssertHelper::operator=(&local_110,&local_108);
    testing::internal::AssertHelper::~AssertHelper(&local_110);
    testing::Message::~Message(&local_108);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f0);
  anon_unknown.dwarf_16b2d::BufferWithReadonlyStrings::~BufferWithReadonlyStrings
            ((BufferWithReadonlyStrings *)local_d0);
  return;
}

Assistant:

TEST(Buffer, change_event_add_pagebreak) {
    BufferWithReadonlyStrings local;

    local.start_listening_to_changes();
    bfy_buffer_add_pagebreak(&local.buf);
    EXPECT_EQ(0, std::size(local.changes));
}